

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
* __thiscall
pbrt::ParsedScene::CreateMedia_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
           *__return_storage_ptr__,ParsedScene *this,Allocator alloc)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  MediumHandle medium;
  string type;
  allocator<char> local_a2;
  allocator<char> local_a1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  *local_a0;
  Allocator local_98;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = __return_storage_ptr__;
  local_98.memoryResource = alloc.memoryResource;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(this->media)._M_t._M_impl.super__Rb_tree_header) {
      return local_a0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"type",&local_a1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_a2);
    ParameterDictionary::GetOneString
              (&local_70,(ParameterDictionary *)(p_Var3 + 3),&local_90,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_70._M_string_length == 0) break;
    if (*(char *)&p_Var3[0xf]._M_parent == '\x01') {
      Warning((FileLoc *)&p_Var3[6]._M_parent,
              "Animated transformation provided for medium. Only the start transform will be used.")
      ;
    }
    MediumHandle::Create
              ((MediumHandle *)&local_90,&local_70,(ParameterDictionary *)(p_Var3 + 3),
               (Transform *)(p_Var3 + 7),(FileLoc *)&p_Var3[6]._M_parent,local_98);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
             ::operator[](local_a0,(key_type *)(p_Var3 + 1));
    (pmVar2->
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    ).bits = (uintptr_t)local_90._M_dataplus._M_p;
    std::__cxx11::string::~string((string *)&local_70);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  }
  ErrorExit((FileLoc *)&p_Var3[6]._M_parent,"No parameter string \"type\" found for medium.");
}

Assistant:

std::map<std::string, MediumHandle> ParsedScene::CreateMedia(Allocator alloc) const {
    std::map<std::string, MediumHandle> mediaMap;

    for (const auto &m : media) {
        std::string type = m.second.parameters.GetOneString("type", "");
        if (type.empty())
            ErrorExit(&m.second.loc, "No parameter string \"type\" found for medium.");

        if (m.second.renderFromObject.IsAnimated())
            Warning(&m.second.loc,
                    "Animated transformation provided for medium. Only the "
                    "start transform will be used.");
        MediumHandle medium = MediumHandle::Create(
            type, m.second.parameters, m.second.renderFromObject.startTransform,
            &m.second.loc, alloc);
        mediaMap[m.first] = medium;
    }

    return mediaMap;
}